

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsDisableRuntimeExecution(JsRuntimeHandle runtimeHandle)

{
  bool bVar1;
  JsrtRuntime *this;
  ThreadContext *this_00;
  Recycler *pRVar2;
  ThreadContext *threadContext;
  JsRuntimeHandle runtimeHandle_local;
  
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    runtimeHandle_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    this = JsrtRuntime::FromHandle(runtimeHandle);
    this_00 = JsrtRuntime::GetThreadContext(this);
    bVar1 = ThreadContext::TestThreadContextFlag(this_00,ThreadContextFlagCanDisableExecution);
    if (bVar1) {
      pRVar2 = ThreadContext::GetRecycler(this_00);
      if (pRVar2 != (Recycler *)0x0) {
        pRVar2 = ThreadContext::GetRecycler(this_00);
        bVar1 = Memory::Recycler::IsHeapEnumInProgress(pRVar2);
        if (bVar1) {
          return JsErrorHeapEnumInProgress;
        }
      }
      bVar1 = ThreadContext::IsInThreadServiceCallback(this_00);
      if (bVar1) {
        runtimeHandle_local._4_4_ = JsErrorInThreadServiceCallback;
      }
      else {
        ThreadContext::DisableExecution(this_00);
        runtimeHandle_local._4_4_ = JsNoError;
      }
    }
    else {
      runtimeHandle_local._4_4_ = JsErrorCannotDisableExecution;
    }
  }
  return runtimeHandle_local._4_4_;
}

Assistant:

CHAKRA_API JsDisableRuntimeExecution(_In_ JsRuntimeHandle runtimeHandle)
{
    VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

    ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
    if (!threadContext->TestThreadContextFlag(ThreadContextFlagCanDisableExecution))
    {
        return JsErrorCannotDisableExecution;
    }

    if (threadContext->GetRecycler() && threadContext->GetRecycler()->IsHeapEnumInProgress())
    {
        return JsErrorHeapEnumInProgress;
    }
    else if (threadContext->IsInThreadServiceCallback())
    {
        return JsErrorInThreadServiceCallback;
    }

    threadContext->DisableExecution();
    return JsNoError;
}